

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

ReturnType __thiscall
pbrt::ParameterDictionary::lookupSingle<(pbrt::ParameterType)7>
          (ParameterDictionary *this,string *name,ReturnType defaultValue)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  char *pcVar3;
  size_t __n;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  char *fmt;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar7;
  ReturnType RVar8;
  float local_4c;
  undefined8 local_48;
  
  local_4c = defaultValue.super_Tuple3<pbrt::Normal3,_float>.z;
  local_48 = defaultValue.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar7 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar7 = paVar1;
  }
  if (sVar2 != 0) {
    lVar6 = 0;
    do {
      pcVar3 = *(char **)((long)paVar7 + lVar6);
      __n = *(size_t *)(pcVar3 + 0x28);
      if ((__n == name->_M_string_length) &&
         (((__n == 0 ||
           (iVar5 = bcmp(*(void **)(pcVar3 + 0x20),(name->_M_dataplus)._M_p,__n), iVar5 == 0)) &&
          (iVar5 = std::__cxx11::string::compare(pcVar3), iVar5 == 0)))) {
        if (*(ulong *)(pcVar3 + 0x70) == 0) {
          fmt = "No values provided for parameter \"%s\".";
        }
        else {
          if (*(ulong *)(pcVar3 + 0x70) < 4) {
            pcVar3[0xb8] = '\x01';
            auVar4 = vcvtpd2ps_avx(**(undefined1 (**) [16])(pcVar3 + 0x60));
            local_48 = auVar4._0_8_;
            local_4c = (float)*(double *)(*(undefined1 (**) [16])(pcVar3 + 0x60))[1];
            break;
          }
          fmt = "More than one value provided for parameter \"%s\".";
        }
        ErrorExit<std::__cxx11::string_const&>((FileLoc *)(pcVar3 + 0x40),fmt,name);
      }
      lVar6 = lVar6 + 8;
    } while (sVar2 << 3 != lVar6);
  }
  RVar8.super_Tuple3<pbrt::Normal3,_float>.z = local_4c;
  RVar8.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_48;
  RVar8.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_48._4_4_;
  return (ReturnType)RVar8.super_Tuple3<pbrt::Normal3,_float>;
}

Assistant:

typename ParameterTypeTraits<PT>::ReturnType ParameterDictionary::lookupSingle(
    const std::string &name,
    typename ParameterTypeTraits<PT>::ReturnType defaultValue) const {
    // Search _params_ for parameter _name_
    using traits = ParameterTypeTraits<PT>;
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != traits::typeName)
            continue;
        // Extract parameter values from _p_
        const auto &values = traits::GetValues(*p);

        // Issue error if incorrect number of parameter values were provided
        if (values.empty())
            ErrorExit(&p->loc, "No values provided for parameter \"%s\".", name);
        if (values.size() > traits::nPerItem)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);

        // Return parameter values as _ReturnType_
        p->lookedUp = true;
        return traits::Convert(values.data(), &p->loc);
    }

    return defaultValue;
}